

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsReport.cpp
# Opt level: O1

QRect __thiscall KDReports::ReportPrivate::mainTextDocRect(ReportPrivate *this)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  qreal qVar5;
  qreal qVar6;
  double dVar7;
  QRect QVar8;
  
  qVar5 = mmToPixels(this->m_marginLeft);
  qVar6 = mmToPixels(this->m_marginTop);
  bVar2 = skipHeadersFooters(this);
  dVar7 = 0.0;
  if (!bVar2) {
    dVar7 = HeaderMap::height(&this->m_headers);
  }
  iVar3 = (int)(qVar5 + (double)((ulong)qVar5 & 0x8000000000000000 | 0x3fe0000000000000));
  qVar5 = mmToPixels(this->m_headerBodySpacing);
  iVar4 = (int)((double)((ulong)(qVar5 + dVar7) & 0x8000000000000000 | (ulong)DAT_001579c0) +
               qVar5 + dVar7) +
          (int)(qVar6 + (double)((ulong)qVar6 & 0x8000000000000000 | 0x3fe0000000000000));
  dVar7 = (this->m_paperSize).wd;
  qVar5 = mmToPixels(this->m_marginLeft + this->m_marginRight);
  dVar7 = dVar7 - qVar5;
  uVar1 = (ulong)DAT_001579c0;
  qVar5 = mainTextDocHeight(this);
  QVar8.x2 = iVar3 + (int)((double)((ulong)dVar7 & 0x8000000000000000 | uVar1) + dVar7) + -1;
  QVar8.y1 = iVar4;
  QVar8.x1 = iVar3;
  QVar8.y2 = (int)((double)((ulong)qVar5 & 0x8000000000000000 | (ulong)DAT_001579c0) + qVar5) +
             iVar4 + -1;
  return QVar8;
}

Assistant:

QRect KDReports::ReportPrivate::mainTextDocRect() const
{
    const int left = qRound(mmToPixels(m_marginLeft));
    const int top = qRound(mmToPixels(m_marginTop));
    const int headerHeightWithSpacing = qRound((skipHeadersFooters() ? 0 : m_headers.height()) + mmToPixels(m_headerBodySpacing));
    const int textDocWidth = qRound(m_paperSize.width() - mmToPixels(m_marginLeft + m_marginRight));
    const int textDocHeight = qRound(mainTextDocHeight());
    return {left, top + headerHeightWithSpacing, textDocWidth, textDocHeight};
}